

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O2

void __thiscall
dtc::fdt::property::parse_cells(property *this,text_input_buffer *input,int cell_size)

{
  size_type sVar1;
  char cVar2;
  bool bVar3;
  ulong uVar4;
  unsigned_long_long val;
  vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_> *local_1c0;
  uint local_1b4;
  string referenced;
  string local_170;
  string local_150;
  property_value v;
  string local_d0;
  string local_b0;
  string msg;
  
  cVar2 = text_input_buffer::operator*(input);
  if (cVar2 != '<') {
    __assert_fail("*input == \'<\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc",
                  0x11b,"void dtc::fdt::property::parse_cells(text_input_buffer &, int)");
  }
  text_input_buffer::operator++(input);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  property_value::property_value(&v,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  text_input_buffer::next_token(input);
  local_1b4 = cell_size << 0x1d | cell_size - 8U >> 3;
  local_1c0 = &this->values;
  uVar4 = (ulong)local_1b4;
  while( true ) {
    bVar3 = text_input_buffer::consume(input,'>');
    if (bVar3) {
      if (v.byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          v.byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::push_back
                  (local_1c0,&v);
      }
      goto LAB_0012c38f;
    }
    text_input_buffer::next_token(input);
    bVar3 = text_input_buffer::consume(input,'&');
    if (!bVar3) break;
    if (cell_size != 0x20) {
      text_input_buffer::parse_error(input,"reference only permitted in 32-bit arrays");
      goto LAB_0012c386;
    }
    text_input_buffer::next_token(input);
    referenced._M_dataplus._M_p = (pointer)&referenced.field_2;
    referenced._M_string_length = 0;
    referenced.field_2._M_local_buf[0] = '\0';
    bVar3 = text_input_buffer::consume(input,'{');
    if (bVar3) {
      text_input_buffer::parse_to_abi_cxx11_(&msg,input,'}');
      std::__cxx11::string::operator=((string *)&referenced,(string *)&msg);
      std::__cxx11::string::~string((string *)&msg);
      text_input_buffer::consume(input,'}');
    }
    else {
      text_input_buffer::parse_node_name_abi_cxx11_(&msg,input);
      std::__cxx11::string::operator=((string *)&referenced,(string *)&msg);
      std::__cxx11::string::~string((string *)&msg);
    }
    sVar1 = referenced._M_string_length;
    if (referenced._M_string_length == 0) {
      text_input_buffer::parse_error(input,"Expected node name");
      this->valid = false;
    }
    else {
      text_input_buffer::next_token(input);
      if (v.byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start !=
          v.byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::push_back
                  (local_1c0,&v);
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        local_150._M_string_length = 0;
        local_150.field_2._M_local_buf[0] = '\0';
        property_value::property_value((property_value *)&msg,&local_150);
        property_value::operator=(&v,(property_value *)&msg);
        property_value::~property_value((property_value *)&msg);
        std::__cxx11::string::~string((string *)&local_150);
      }
      std::__cxx11::string::_M_assign((string *)&v.string_data);
      v.type = PHANDLE;
      std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::push_back
                (local_1c0,&v);
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      local_170._M_string_length = 0;
      local_170.field_2._M_local_buf[0] = '\0';
      property_value::property_value((property_value *)&msg,&local_170);
      property_value::operator=(&v,(property_value *)&msg);
      property_value::~property_value((property_value *)&msg);
      std::__cxx11::string::~string((string *)&local_170);
    }
    std::__cxx11::string::~string((string *)&referenced);
    if (sVar1 == 0) {
LAB_0012c38f:
      property_value::~property_value(&v);
      return;
    }
  }
  bVar3 = text_input_buffer::consume_integer_expression(input,&val);
  if (bVar3) {
    if (((0x3f < cell_size) || (val >> ((byte)cell_size & 0x3f) == 0)) ||
       ((val | ~(-1L << ((byte)cell_size - 1 & 0x3f))) == 0xffffffffffffffff)) {
      if (7 < local_1b4) {
        __assert_fail("0 && \"Invalid cell size!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc"
                      ,0x176,"void dtc::fdt::property::parse_cells(text_input_buffer &, int)");
      }
      (*(code *)(&DAT_0013e9ac + *(int *)(&DAT_0013e9ac + uVar4 * 4)))();
      return;
    }
    std::__cxx11::to_string(&local_d0,cell_size);
    std::operator+(&referenced,"Value does not fit in a ",&local_d0);
    std::operator+(&msg,&referenced,"-bit cell");
    std::__cxx11::string::~string((string *)&referenced);
    std::__cxx11::string::~string((string *)&local_d0);
    text_input_buffer::parse_error(input,msg._M_dataplus._M_p);
    this->valid = false;
    std::__cxx11::string::~string((string *)&msg);
  }
  else {
    text_input_buffer::parse_error(input,"Expected numbers in array of cells");
LAB_0012c386:
    this->valid = false;
  }
  goto LAB_0012c38f;
}

Assistant:

void
property::parse_cells(text_input_buffer &input, int cell_size)
{
	assert(*input == '<');
	++input;
	property_value v;
	input.next_token();
	while (!input.consume('>'))
	{
		input.next_token();
		// If this is a phandle then we need to get the name of the
		// referenced node
		if (input.consume('&'))
		{
			if (cell_size != 32)
			{
				input.parse_error("reference only permitted in 32-bit arrays");
				valid = false;
				return;
			}
			input.next_token();
			string referenced;
			if (!input.consume('{'))
			{
				referenced = input.parse_node_name();
			}
			else
			{
				referenced = input.parse_to('}');
				input.consume('}');
			}
			if (referenced.empty())
			{
				input.parse_error("Expected node name");
				valid = false;
				return;
			}
			input.next_token();
			// If we already have some bytes, make the phandle a
			// separate component.
			if (!v.byte_data.empty())
			{
				values.push_back(v);
				v = property_value();
			}
			v.string_data = referenced;
			v.type = property_value::PHANDLE;
			values.push_back(v);
			v = property_value();
		}
		else
		{
			//FIXME: We should support labels in the middle
			//of these, but we don't.
			unsigned long long val;
			if (!input.consume_integer_expression(val))
			{
				// FIXME: Distinguish invalid syntax from a
				// number that cannot be represented in an
				// unsigned long long.
				input.parse_error("Expected numbers in array of cells");
				valid = false;
				return;
			}
			// FIXME: No sign information available, so cannot
			// distinguish small negative values from large
			// positive ones, and thus we have to conservatively
			// permit anything that looks like a sign-extended
			// negative integer.
			if (cell_size < 64 && val >= (1ull << cell_size) &&
			    (val | ((1ull << (cell_size - 1)) - 1)) !=
			    std::numeric_limits<unsigned long long>::max())
			{
				std::string msg = "Value does not fit in a " +
					std::to_string(cell_size) + "-bit cell";
				input.parse_error(msg.c_str());
				valid = false;
				return;
			}
			switch (cell_size)
			{
				case 8:
					v.byte_data.push_back(val);
					break;
				case 16:
					push_big_endian(v.byte_data, (uint16_t)val);
					break;
				case 32:
					push_big_endian(v.byte_data, (uint32_t)val);
					break;
				case 64:
					push_big_endian(v.byte_data, (uint64_t)val);
					break;
				default:
					assert(0 && "Invalid cell size!");
			}
			input.next_token();
		}
	}
	// Don't store an empty string value here.
	if (v.byte_data.size() > 0)
	{
		values.push_back(v);
	}
}